

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O1

int Fl_Widget::test_shortcut(char *t,bool require_alt)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((t != (char *)0x0) && ((!require_alt || ((Fl::e_state._2_1_ & 8) != 0)))) {
    uVar2 = 0;
    uVar1 = fl_utf8decode(Fl::e_text,Fl::e_text + Fl::e_length,(wchar_t *)0x0);
    if (uVar1 != 0) {
      uVar2 = label_shortcut(t);
      uVar2 = (uint)(uVar1 == uVar2);
    }
  }
  return uVar2;
}

Assistant:

int Fl_Widget::test_shortcut(const char *t, const bool require_alt) {
  if (!t) return 0;
  // for menubars etc. shortcuts must work only if the Alt modifier is pressed
  if (require_alt && Fl::event_state(FL_ALT)==0) return 0;
  unsigned int c = fl_utf8decode(Fl::event_text(), Fl::event_text()+Fl::event_length(), 0);
#ifdef __APPLE__
  // this line makes underline shortcuts work the same way they do on MSWindow
  // and Linux. 
  if (c && Fl::event_state(FL_ALT)) 
    c = Fl::event_key();
#endif
  if (!c) return 0;
  unsigned int ls = label_shortcut(t);
  if (c == ls)
    return 1;
#ifdef __APPLE__
  // On OS X, we need to simulate the upper case keystroke as well
  if (Fl::event_state(FL_ALT) && c<128 && isalpha(c) && (unsigned)toupper(c)==ls)
    return 1;
#endif
  return 0;
}